

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-close.c
# Opt level: O1

int run_test_loop_close(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 extraout_RAX;
  undefined8 uVar2;
  uv_timer_t *puVar3;
  uv_timer_t *puVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  uv_loop_t loop;
  uv_timer_t local_360 [5];
  
  puVar3 = local_360;
  puVar4 = puVar3;
  local_360[0].data = puVar3;
  iVar1 = uv_loop_init();
  if (iVar1 == 0) {
    if ((uv_timer_t *)local_360[0].data != puVar3) goto LAB_001639ca;
    puVar3 = &timer_handle;
    puVar4 = local_360;
    uv_timer_init(puVar4,&timer_handle);
    uv_timer_start(&timer_handle,timer_cb,100,100);
    iVar1 = uv_loop_close();
    if (iVar1 != -0x10) goto LAB_001639cf;
    puVar3 = local_360;
    uv_run(puVar3,0);
    uv_close(&timer_handle,0);
    puVar4 = puVar3;
    iVar1 = uv_run(puVar3,0);
    if (iVar1 != 0) goto LAB_001639d4;
    if ((uv_timer_t *)local_360[0].data != puVar3) goto LAB_001639d9;
    puVar3 = local_360;
    puVar4 = puVar3;
    iVar1 = uv_loop_close();
    if (iVar1 != 0) goto LAB_001639de;
    if ((uv_timer_t *)local_360[0].data == puVar3) {
      return 0;
    }
  }
  else {
    run_test_loop_close_cold_1();
LAB_001639ca:
    run_test_loop_close_cold_2();
LAB_001639cf:
    run_test_loop_close_cold_3();
LAB_001639d4:
    run_test_loop_close_cold_4();
LAB_001639d9:
    run_test_loop_close_cold_5();
LAB_001639de:
    run_test_loop_close_cold_6();
  }
  run_test_loop_close_cold_7();
  if (puVar4 != (uv_timer_t *)0x0) {
    iVar1 = uv_stop(puVar4->loop);
    return iVar1;
  }
  uVar2 = extraout_RAX;
  timer_cb_cold_1();
  iVar1 = uv_loop_init(&run_test_loop_instant_close::loop);
  if (iVar1 == 0) {
    iVar1 = uv_queue_work(&run_test_loop_instant_close::loop,&run_test_loop_instant_close::req,
                          loop_instant_close_work_cb,loop_instant_close_after_work_cb,in_R8,in_R9,
                          puVar3,uVar2);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00163a74;
    }
  }
  else {
    run_test_loop_instant_close_cold_1();
  }
  run_test_loop_instant_close_cold_2();
LAB_00163a74:
  run_test_loop_instant_close_cold_3();
  return extraout_EAX;
}

Assistant:

TEST_IMPL(loop_close) {
  int r;
  uv_loop_t loop;

  loop.data = &loop;
  ASSERT(0 == uv_loop_init(&loop));
  ASSERT(loop.data == (void*) &loop);

  uv_timer_init(&loop, &timer_handle);
  uv_timer_start(&timer_handle, timer_cb, 100, 100);

  ASSERT(UV_EBUSY == uv_loop_close(&loop));

  uv_run(&loop, UV_RUN_DEFAULT);

  uv_close((uv_handle_t*) &timer_handle, NULL);
  r = uv_run(&loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(loop.data == (void*) &loop);
  ASSERT(0 == uv_loop_close(&loop));
  ASSERT(loop.data == (void*) &loop);

  return 0;
}